

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::shift<(moira::Core)2,(moira::Instr)95,2>(Moira *this,int cnt,u64 data)

{
  bool bVar1;
  u32 uVar2;
  int local_28;
  bool local_21;
  int i;
  bool carry;
  u64 data_local;
  int cnt_local;
  Moira *this_local;
  
  local_21 = false;
  _i = data;
  for (local_28 = 0; local_28 < cnt; local_28 = local_28 + 1) {
    local_21 = (_i & 1) != 0;
    _i = _i >> 1;
    if (local_21) {
      uVar2 = MSBIT<2>();
      _i = uVar2 | _i;
    }
  }
  (this->reg).sr.c = local_21;
  (this->reg).sr.v = false;
  bVar1 = NBIT<2>(_i);
  (this->reg).sr.n = bVar1;
  bVar1 = ZERO<2>(_i);
  (this->reg).sr.z = bVar1;
  uVar2 = CLIP<2>(_i);
  return uVar2;
}

Assistant:

u32
Moira::shift(int cnt, u64 data) {

    switch (I) {

        case Instr::ASL:
        case Instr::ASL_LOOP:
        {
            bool carry = false;
            u32 changed = 0;

            for (int i = 0; i < cnt; i++) {

                carry = NBIT<S>(data);
                u64 shifted = (data & 0xFFFFFFFF) << 1;
                changed |= (u32)(data ^ shifted);
                data = shifted;
            }

            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = NBIT<S>(changed);
            break;
        }
        case Instr::ASR:
        case Instr::ASR_LOOP:
        {
            bool carry = false;
            u32 changed = 0;

            for (int i = 0; i < cnt; i++) {

                carry = data & 1;
                u64 shifted = SEXT<S>(data) >> 1;
                changed |= (u32)(data ^ shifted);
                data = shifted;
            }

            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = NBIT<S>(changed);
            break;
        }
        case Instr::LSL:
        case Instr::LSL_LOOP:
        {
            bool carry = false;

            for (int i = 0; i < cnt; i++) {

                carry = NBIT<S>(data);
                data = data << 1;
            }

            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::LSR:
        case Instr::LSR_LOOP:
        {
            bool carry = false;

            for (int i = 0; i < cnt; i++) {

                carry = data & 1;
                data = data >> 1;
            }

            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::ROL:
        case Instr::ROL_LOOP:
        {
            bool carry = false;

            for (int i = 0; i < cnt; i++) {

                carry = NBIT<S>(data);
                data = data << 1 | (carry ? 1 : 0);
            }

            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::ROR:
        case Instr::ROR_LOOP:
        {
            bool carry = false;

            for (int i = 0; i < cnt; i++) {

                carry = data & 1;
                data >>= 1;
                if (carry) data |= MSBIT<S>();
            }

            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::ROXL:
        case Instr::ROXL_LOOP:
        {
            bool carry = reg.sr.x;

            for (int i = 0; i < cnt; i++) {

                bool extend = carry;
                carry = NBIT<S>(data);
                data = data << 1 | (extend ? 1 : 0);
            }

            reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case Instr::ROXR:
        case Instr::ROXR_LOOP:
        {
            bool carry = reg.sr.x;

            for (int i = 0; i < cnt; i++) {

                bool extend = carry;
                carry = data & 1;
                data >>= 1;
                if (extend) data |= MSBIT<S>();
            }

            reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);

    return CLIP<S>(data);
}